

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

void __thiscall
CTxMemPool::TrimToSize
          (CTxMemPool *this,size_t sizelimit,
          vector<COutPoint,_std::allocator<COutPoint>_> *pvNoSpendsRemaining)

{
  long lVar1;
  pointer poVar2;
  pointer pCVar3;
  undefined8 uVar4;
  pointer pCVar5;
  bool bVar6;
  uint uVar7;
  size_t sVar8;
  _Base_ptr p_Var9;
  pointer pCVar10;
  Level level;
  pointer stage_00;
  CTxMemPool *this_00;
  CTxIn *txin;
  txiter entryit;
  pointer __x;
  long in_FS_OFFSET;
  double dVar11;
  string_view source_file;
  string_view logging_function;
  long local_e0;
  vector<CTransaction,_std::allocator<CTransaction>_> txn;
  CFeeRate removed;
  CFeeRate maxFeeRateRemoved;
  uint nTxnRemoved;
  FeeEstimateMode local_8c;
  uchar auStack_88 [5];
  uchar auStack_83 [8];
  uchar local_7b [19];
  setEntries stage;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  nTxnRemoved = 0;
  maxFeeRateRemoved.nSatoshisPerK = 0;
  uVar7 = 0;
  local_e0 = 0;
  stage_00 = (pointer)sizelimit;
  while ((level = (Level)stage_00, (this->mapTx).node_count != 0 &&
         (sVar8 = DynamicMemoryUsage(this), sizelimit < sVar8))) {
    poVar2 = (((this->mapTx).
               super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
              .member)->
             super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
             ).
             super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
             .
             super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
             .
             super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
             .
             super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
             .super_type.left_;
    entryit.node = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                    *)&poVar2[-0xe].
                       super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
                       .super_type.right_;
    if (poVar2 == (pointer)0x0) {
      entryit.node = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                      *)0x0;
    }
    stage._M_t._M_impl._0_8_ =
         *(undefined8 *)
          ((long)&((entryit.node)->
                  super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                  ).
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                  .
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                  .
                  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                  .super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>.
                  super_pod_value_holder<CTxMemPoolEntry>.space + 0xd8);
    this_00 = (CTxMemPool *)&removed;
    CFeeRate::CFeeRate((CFeeRate *)this_00,(CAmount *)&stage,
                       *(uint32_t *)
                        ((long)&((entryit.node)->
                                super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                ).
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                .
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                .
                                super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                .
                                super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                .super_pod_value_holder<CTxMemPoolEntry>.space + 0xd0));
    removed.nSatoshisPerK =
         removed.nSatoshisPerK + (this->m_opts).incremental_relay_feerate.nSatoshisPerK;
    dVar11 = (double)removed.nSatoshisPerK;
    if (this->rollingMinimumFeeRate <= dVar11 && dVar11 != this->rollingMinimumFeeRate) {
      this->rollingMinimumFeeRate = dVar11;
      this->blockSinceLastRollingFeeBump = false;
    }
    if (local_e0 <= removed.nSatoshisPerK) {
      local_e0 = removed.nSatoshisPerK;
    }
    stage._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    stage._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    stage._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &stage._M_t._M_impl.super__Rb_tree_header._M_header;
    stage._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    maxFeeRateRemoved.nSatoshisPerK = local_e0;
    stage._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         stage._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    CalculateDescendants(this_00,entryit,&stage);
    txn.super__Vector_base<CTransaction,_std::allocator<CTransaction>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar7 = uVar7 + (int)stage._M_t._M_impl.super__Rb_tree_header._M_node_count;
    txn.super__Vector_base<CTransaction,_std::allocator<CTransaction>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    txn.super__Vector_base<CTransaction,_std::allocator<CTransaction>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    nTxnRemoved = uVar7;
    if (pvNoSpendsRemaining != (vector<COutPoint,_std::allocator<COutPoint>_> *)0x0) {
      std::vector<CTransaction,_std::allocator<CTransaction>_>::reserve
                (&txn,stage._M_t._M_impl.super__Rb_tree_header._M_node_count);
      for (p_Var9 = stage._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &stage._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        std::vector<CTransaction,_std::allocator<CTransaction>_>::push_back
                  (&txn,(value_type *)**(undefined8 **)(p_Var9 + 1));
      }
    }
    stage_00 = (pointer)&stage;
    RemoveStaged(this,(setEntries *)stage_00,false,SIZELIMIT);
    pCVar5 = txn.super__Vector_base<CTransaction,_std::allocator<CTransaction>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pCVar10 = txn.super__Vector_base<CTransaction,_std::allocator<CTransaction>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pvNoSpendsRemaining != (vector<COutPoint,_std::allocator<COutPoint>_> *)0x0) {
      for (; pCVar10 != pCVar5; pCVar10 = pCVar10 + 1) {
        pCVar3 = (pCVar10->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (__x = (pCVar10->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start; __x != pCVar3; __x = __x + 1) {
          uVar4 = *(undefined8 *)(__x->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems
          ;
          auStack_83 = *(uchar (*) [8])
                        ((__x->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
          local_7b._0_8_ =
               *(undefined8 *)
                ((__x->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
          local_7b._8_8_ =
               *(undefined8 *)
                ((__x->prevout).hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
          local_8c._1_3_ = (undefined3)uVar4;
          local_8c = (uint)(uint3)local_8c._1_3_ << 8;
          auStack_88 = SUB85((ulong)uVar4 >> 0x18,0);
          stage_00 = (pointer)&local_8c;
          bVar6 = exists(this,(GenTxid *)&local_8c);
          if (!bVar6) {
            stage_00 = __x;
            std::vector<COutPoint,_std::allocator<COutPoint>_>::push_back
                      (pvNoSpendsRemaining,&__x->prevout);
          }
        }
      }
    }
    std::vector<CTransaction,_std::allocator<CTransaction>_>::~vector(&txn);
    std::_Rb_tree<$270907ca$>::~_Rb_tree(&stage._M_t);
  }
  if ((0 < local_e0) && (bVar6 = ::LogAcceptCategory(NET,level), bVar6)) {
    local_8c = BTC_KVB;
    CFeeRate::ToString_abi_cxx11_((string *)&stage,&maxFeeRateRemoved,&local_8c);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txmempool.cpp"
    ;
    source_file._M_len = 0x5d;
    logging_function._M_str = "TrimToSize";
    logging_function._M_len = 10;
    LogPrintFormatInternal<unsigned_int,std::__cxx11::string>
              (logging_function,source_file,0x48f,MEMPOOL,Debug,(ConstevalFormatString<2U>)0xcd0056,
               &nTxnRemoved,(string *)&stage);
    std::__cxx11::string::~string((string *)&stage);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CTxMemPool::TrimToSize(size_t sizelimit, std::vector<COutPoint>* pvNoSpendsRemaining) {
    AssertLockHeld(cs);

    unsigned nTxnRemoved = 0;
    CFeeRate maxFeeRateRemoved(0);
    while (!mapTx.empty() && DynamicMemoryUsage() > sizelimit) {
        indexed_transaction_set::index<descendant_score>::type::iterator it = mapTx.get<descendant_score>().begin();

        // We set the new mempool min fee to the feerate of the removed set, plus the
        // "minimum reasonable fee rate" (ie some value under which we consider txn
        // to have 0 fee). This way, we don't allow txn to enter mempool with feerate
        // equal to txn which were removed with no block in between.
        CFeeRate removed(it->GetModFeesWithDescendants(), it->GetSizeWithDescendants());
        removed += m_opts.incremental_relay_feerate;
        trackPackageRemoved(removed);
        maxFeeRateRemoved = std::max(maxFeeRateRemoved, removed);

        setEntries stage;
        CalculateDescendants(mapTx.project<0>(it), stage);
        nTxnRemoved += stage.size();

        std::vector<CTransaction> txn;
        if (pvNoSpendsRemaining) {
            txn.reserve(stage.size());
            for (txiter iter : stage)
                txn.push_back(iter->GetTx());
        }
        RemoveStaged(stage, false, MemPoolRemovalReason::SIZELIMIT);
        if (pvNoSpendsRemaining) {
            for (const CTransaction& tx : txn) {
                for (const CTxIn& txin : tx.vin) {
                    if (exists(GenTxid::Txid(txin.prevout.hash))) continue;
                    pvNoSpendsRemaining->push_back(txin.prevout);
                }
            }
        }
    }

    if (maxFeeRateRemoved > CFeeRate(0)) {
        LogDebug(BCLog::MEMPOOL, "Removed %u txn, rolling minimum fee bumped to %s\n", nTxnRemoved, maxFeeRateRemoved.ToString());
    }
}